

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

int noise_state_init(aom_noise_state_t *state,int n,int bit_depth)

{
  int iVar1;
  
  iVar1 = equation_system_init(&state->eqns,n);
  if (iVar1 != 0) {
    state->ar_gain = 1.0;
    state->num_observations = 0;
    (state->strength_solver).eqns.A = (double *)0x0;
    (state->strength_solver).eqns.b = (double *)0x0;
    (state->strength_solver).eqns.x = (double *)0x0;
    *(undefined8 *)&(state->strength_solver).eqns.n = 0;
    (state->strength_solver).num_bins = 0x14;
    (state->strength_solver).num_equations = 0;
    (state->strength_solver).min_intensity = 0.0;
    (state->strength_solver).max_intensity = (double)~(-1 << ((byte)bit_depth & 0x1f));
    (state->strength_solver).total = 0.0;
    iVar1 = equation_system_init(&(state->strength_solver).eqns,0x14);
    return iVar1;
  }
  fprintf(_stderr,"Failed initialization noise state with size %d\n",(ulong)(uint)n);
  return 0;
}

Assistant:

static int noise_state_init(aom_noise_state_t *state, int n, int bit_depth) {
  const int kNumBins = 20;
  if (!equation_system_init(&state->eqns, n)) {
    fprintf(stderr, "Failed initialization noise state with size %d\n", n);
    return 0;
  }
  state->ar_gain = 1.0;
  state->num_observations = 0;
  return aom_noise_strength_solver_init(&state->strength_solver, kNumBins,
                                        bit_depth);
}